

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O0

void Dau_DecTrySets(word *pInit,int nVars,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p;
  uint uSet;
  int Entry;
  int i;
  Vec_Int_t *vSets;
  int fVerbose_local;
  int nVars_local;
  word *pInit_local;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                  ,0x343,"void Dau_DecTrySets(word *, int, int)");
  }
  p = Dau_DecFindSets(pInit,nVars);
  if (fVerbose == 0) {
    Vec_IntFree(p);
  }
  else {
    Dau_DsdPrintFromTruth(pInit,nVars);
    uVar1 = Vec_IntSize(p);
    printf("This %d-variable function has %d decomposable variable sets:\n",(ulong)(uint)nVars,
           (ulong)uVar1);
    for (uSet = 0; iVar2 = Vec_IntSize(p), (int)uSet < iVar2; uSet = uSet + 1) {
      uVar1 = Vec_IntEntry(p,uSet);
      printf("Set %4d : ",(ulong)uSet);
      if (nVars < 7) {
        Dau_DecPrintSet(uVar1,nVars,1);
        Dau_DecPerform6(pInit,nVars,uVar1);
      }
      else {
        Dau_DecPrintSet(uVar1,nVars,0);
        Dau_DecPerform(pInit,nVars,uVar1);
      }
    }
    Vec_IntFree(p);
  }
  return;
}

Assistant:

void Dau_DecTrySets( word * pInit, int nVars, int fVerbose )
{
    Vec_Int_t * vSets;
    int i, Entry;
    assert( nVars <= 16 );
    vSets = Dau_DecFindSets( pInit, nVars );
    if ( !fVerbose )
    {
        Vec_IntFree( vSets );
        return;
    }
    Dau_DsdPrintFromTruth( pInit, nVars ); 
    printf( "This %d-variable function has %d decomposable variable sets:\n", nVars, Vec_IntSize(vSets) );
    Vec_IntForEachEntry( vSets, Entry, i )
    {
        unsigned uSet = (unsigned)Entry;
        printf( "Set %4d : ", i );
        if ( nVars > 6 )
        {
            Dau_DecPrintSet( uSet, nVars, 0 );
            Dau_DecPerform( pInit, nVars, uSet );
        }
        else
        {
            Dau_DecPrintSet( uSet, nVars, 1 );
            Dau_DecPerform6( pInit, nVars, uSet );
        }
    }
    Vec_IntFree( vSets );
//    printf( "\n" );
}